

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  int iVar1;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_normalize_cold_2();
  }
  else if (sigin != (secp256k1_ecdsa_signature *)0x0) {
    local_38 = *(undefined8 *)sigin->data;
    uStack_30 = *(undefined8 *)(sigin->data + 8);
    local_28 = *(undefined8 *)(sigin->data + 0x10);
    uStack_20 = *(undefined8 *)(sigin->data + 0x18);
    local_58.d[0] = *(uint64_t *)(sigin->data + 0x20);
    local_58.d[1] = *(uint64_t *)(sigin->data + 0x28);
    local_58.d[2] = *(uint64_t *)(sigin->data + 0x30);
    local_58.d[3] = *(uint64_t *)(sigin->data + 0x38);
    iVar1 = secp256k1_scalar_is_high(&local_58);
    if (sigout == (secp256k1_ecdsa_signature *)0x0) {
      return iVar1;
    }
    if (iVar1 != 0) {
      secp256k1_scalar_negate(&local_58,&local_58);
    }
    *(undefined8 *)(sigout->data + 0x10) = local_28;
    *(undefined8 *)(sigout->data + 0x18) = uStack_20;
    *(undefined8 *)sigout->data = local_38;
    *(undefined8 *)(sigout->data + 8) = uStack_30;
    *(uint64_t *)(sigout->data + 0x20) = local_58.d[0];
    *(uint64_t *)(sigout->data + 0x28) = local_58.d[1];
    *(uint64_t *)(sigout->data + 0x30) = local_58.d[2];
    *(uint64_t *)(sigout->data + 0x38) = local_58.d[3];
    return iVar1;
  }
  secp256k1_ecdsa_signature_normalize_cold_1();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}